

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

opj_bool opj_set_decoded_resolution_factor(opj_codec_t *p_codec,OPJ_UINT32 res_factor)

{
  undefined4 in_register_00000034;
  
  if (p_codec == (opj_codec_t *)0x0) {
    fwrite("[ERROR] Input parameters of the setup_decoder function are incorrect.\n",0x46,1,_stderr)
    ;
  }
  else {
    (*(code *)p_codec[9])(p_codec[10],CONCAT44(in_register_00000034,res_factor),p_codec[0xb]);
  }
  return (uint)(p_codec != (opj_codec_t *)0x0);
}

Assistant:

opj_bool OPJ_CALLCONV opj_set_decoded_resolution_factor(opj_codec_t *p_codec, OPJ_UINT32 res_factor)
{
	opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

	if ( !l_codec ){
		fprintf(stderr, "[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
		return OPJ_FALSE;
	}


	l_codec->m_codec_data.m_decompression.opj_set_decoded_resolution_factor(l_codec->m_codec, res_factor, l_codec->m_event_mgr);

	return OPJ_TRUE;
}